

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

int create_swapchain(Init *init)

{
  SwapchainBuilder *this;
  ostream *poVar1;
  long lVar2;
  int iVar3;
  anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 *paVar4;
  Swapchain *swapchain;
  byte bVar5;
  Result<vkb::Swapchain> swap_ret;
  SwapchainBuilder swapchain_builder;
  long *local_148;
  long local_140;
  long local_138 [2];
  anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 local_128;
  char local_c8;
  SwapchainBuilder local_c0;
  
  bVar5 = 0;
  vkb::SwapchainBuilder::SwapchainBuilder(&local_c0,&init->device);
  swapchain = &init->swapchain;
  this = vkb::SwapchainBuilder::set_old_swapchain(&local_c0,swapchain);
  vkb::SwapchainBuilder::build((Result<vkb::Swapchain> *)&local_128.m_value,this);
  if (local_c8 == '\0') {
    (**(code **)(*(long *)local_128.m_value.swapchain + 0x20))
              (&local_148,local_128.m_value.swapchain,local_128.m_error.type._M_value);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_148,local_140);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (local_c8 == '\x01') {
      __assert_fail("!m_init",
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                    ,0x8e,
                    "VkResult vkb::Result<vkb::Swapchain>::vk_result() const [T = vkb::Swapchain]");
    }
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_128.m_error.vk_result);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (local_148 != local_138) {
      operator_delete(local_148,local_138[0] + 1);
    }
    iVar3 = -1;
  }
  else {
    vkb::destroy_swapchain(swapchain);
    if (local_c8 == '\0') {
      __assert_fail("m_init",
                    "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                    ,0x88,"T &vkb::Result<vkb::Swapchain>::value() & [T = vkb::Swapchain]");
    }
    paVar4 = &local_128;
    for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
      swapchain->device = (paVar4->m_value).device;
      paVar4 = (anon_union_96_2_293c120a_for_Result<vkb::Swapchain>_1 *)
               ((long)paVar4 + ((ulong)bVar5 * -2 + 1) * 8);
      swapchain = (Swapchain *)((long)swapchain + (ulong)bVar5 * -0x10 + 8);
    }
    iVar3 = 0;
  }
  if (local_c0.info.desired_present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.info.desired_present_modes.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.info.desired_present_modes.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.info.desired_present_modes.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.info.desired_formats.
      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.info.desired_formats.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.info.desired_formats.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.info.desired_formats.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.info.pNext_chain.
      super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.info.pNext_chain.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.info.pNext_chain.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.info.pNext_chain.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int create_swapchain(Init& init) {

    vkb::SwapchainBuilder swapchain_builder{ init.device };
    auto swap_ret = swapchain_builder.set_old_swapchain(init.swapchain).build();
    if (!swap_ret) {
        std::cout << swap_ret.error().message() << " " << swap_ret.vk_result() << "\n";
        return -1;
    }
    vkb::destroy_swapchain(init.swapchain);
    init.swapchain = swap_ret.value();
    return 0;
}